

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_classes.h
# Opt level: O1

archive * cppcms::operator&(archive *a,shared_ptr<int> *object)

{
  int iVar1;
  
  iVar1 = cppcms::archive::mode();
  if (iVar1 == 0) {
    archive_traits<std::shared_ptr<int>,_void>::save(object,a);
  }
  else {
    archive_traits<std::shared_ptr<int>,_void>::load(object,a);
  }
  return a;
}

Assistant:

archive & operator &(archive &a,Archivable &object)
	{
		if(a.mode() == archive::save_to_archive)
			archive_traits<Archivable>::save(object,a);
		else
			archive_traits<Archivable>::load(object,a);
		return a;
	}